

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O3

double __thiscall AmpIO::GetMotorVoltageRatio(AmpIO *this,uint index)

{
  uint32_t uVar1;
  double dVar2;
  
  uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
  dVar2 = 0.0;
  if ((uVar1 == 0x64524131) && (index < this->NumMotors)) {
    dVar2 = (double)((float)((int)(short)this->ReadBuffer[index + this->MOTOR_STATUS_OFFSET] >> 5) /
                    1023.0);
  }
  return dVar2;
}

Assistant:

double AmpIO::GetMotorVoltageRatio(unsigned int index) const
{
    if (GetHardwareVersion() != dRA1_String)
        return 0.0;

    if (index >= NumMotors) {
        return 0.0;
    }
    quadlet_t buff;
    buff = ReadBuffer[index+MOTOR_STATUS_OFFSET];
    int16_t raw = buff & 0xffff;
    return (raw >> 5) / 1023.0l;
}